

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

bool binary_fuse8_populate(uint64_t *keys,uint32_t size,binary_fuse8_t *filter)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint64_t uVar8;
  size_t sVar9;
  uint64_t uVar10;
  uint64_t *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint8_t found_1;
  uint8_t xor2;
  uint64_t hash_3;
  uint32_t i_4;
  uint32_t other_index2;
  uint32_t other_index1;
  uint8_t found;
  uint64_t hash_2;
  uint32_t index;
  uint32_t stacksize;
  uint32_t i_3;
  uint32_t Qsize;
  uint32_t h2;
  uint32_t h1;
  uint32_t h0;
  uint64_t hash_1;
  uint32_t i_2;
  uint32_t duplicates;
  int error;
  uint64_t segment_index;
  uint64_t hash;
  uint32_t i_1;
  uint64_t maskblock;
  uint32_t i;
  int loop;
  uint32_t h012 [5];
  uint32_t *startPos;
  uint32_t block;
  uint32_t blockBits;
  uint64_t *t2hash;
  uint8_t *reverseH;
  uint8_t *t2count;
  uint32_t *alone;
  uint32_t capacity;
  uint64_t *reverseOrder;
  uint64_t rng_counter;
  int local_118;
  int local_114;
  int in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  uint64_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_bc;
  int local_b8;
  int local_b4;
  ulong local_b0;
  uint local_9c;
  uint local_90;
  int local_8c;
  uint32_t local_88 [4];
  uint32_t local_78;
  void *local_68;
  uint local_60;
  int local_5c;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  uint local_34;
  void *local_30;
  uint64_t local_28;
  uint64_t *local_20;
  uint local_14;
  long local_10;
  
  local_28 = 0x726b2b9d438b9d4d;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar8 = binary_fuse_rng_splitmix64(&local_28);
  *local_20 = uVar8;
  local_30 = calloc((ulong)(local_14 + 1),8);
  local_34 = (uint)local_20[3];
  local_40 = malloc((ulong)local_34 << 2);
  local_48 = calloc((ulong)local_34,1);
  local_50 = malloc((ulong)local_14);
  local_58 = calloc((ulong)local_34,8);
  for (local_5c = 1; bVar3 = (byte)local_5c, (uint)(1 << (bVar3 & 0x1f)) < (uint)local_20[2];
      local_5c = local_5c + 1) {
  }
  local_60 = 1 << (bVar3 & 0x1f);
  local_68 = malloc((long)(1 << (bVar3 & 0x1f)) << 2);
  if (((((local_40 == (void *)0x0) || (local_48 == (void *)0x0)) || (local_50 == (void *)0x0)) ||
      ((local_58 == (void *)0x0 || (local_30 == (void *)0x0)))) || (local_68 == (void *)0x0)) {
    free(local_40);
    free(local_48);
    free(local_50);
    free(local_58);
    free(local_30);
    free(local_68);
  }
  else {
    *(undefined8 *)((long)local_30 + (ulong)local_14 * 8) = 1;
    for (local_8c = 0; local_8c + 1 < 0x65; local_8c = local_8c + 1) {
      for (local_90 = 0; local_90 < local_60; local_90 = local_90 + 1) {
        *(int *)((long)local_68 + (ulong)local_90 * 4) =
             (int)((ulong)local_90 * (ulong)local_14 >> ((byte)local_5c & 0x3f));
      }
      uVar4 = local_60 - 1;
      for (local_9c = 0; local_9c < local_14; local_9c = local_9c + 1) {
        uVar8 = binary_fuse_murmur64(*(long *)(local_10 + (ulong)local_9c * 8) + *local_20);
        local_b0 = uVar8 >> (0x40U - (char)local_5c & 0x3f);
        while (*(long *)((long)local_30 + (ulong)*(uint *)((long)local_68 + local_b0 * 4) * 8) != 0)
        {
          local_b0 = (ulong)uVar4 & local_b0 + 1;
        }
        *(uint64_t *)((long)local_30 + (ulong)*(uint *)((long)local_68 + local_b0 * 4) * 8) = uVar8;
        *(int *)((long)local_68 + local_b0 * 4) = *(int *)((long)local_68 + local_b0 * 4) + 1;
      }
      local_b4 = 0;
      local_b8 = 0;
      for (local_bc = 0; local_bc < local_14; local_bc = local_bc + 1) {
        uVar1 = *(ulong *)((long)local_30 + (ulong)local_bc * 8);
        uVar5 = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                  (binary_fuse8_t *)
                                  CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT24(in_stack_fffffffffffffef4,
                                                             in_stack_fffffffffffffef0))));
        *(char *)((long)local_48 + (ulong)uVar5) = *(char *)((long)local_48 + (ulong)uVar5) + '\x04'
        ;
        *(ulong *)((long)local_58 + (ulong)uVar5 * 8) =
             uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar5 * 8);
        uVar6 = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                  (binary_fuse8_t *)
                                  CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT24(in_stack_fffffffffffffef4,
                                                             in_stack_fffffffffffffef0))));
        *(char *)((long)local_48 + (ulong)uVar6) = *(char *)((long)local_48 + (ulong)uVar6) + '\x04'
        ;
        *(byte *)((long)local_48 + (ulong)uVar6) = *(byte *)((long)local_48 + (ulong)uVar6) ^ 1;
        *(ulong *)((long)local_58 + (ulong)uVar6 * 8) =
             uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar6 * 8);
        uVar7 = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                  (binary_fuse8_t *)
                                  CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT24(in_stack_fffffffffffffef4,
                                                             in_stack_fffffffffffffef0))));
        *(char *)((long)local_48 + (ulong)uVar7) = *(char *)((long)local_48 + (ulong)uVar7) + '\x04'
        ;
        *(ulong *)((long)local_58 + (ulong)uVar7 * 8) =
             uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar7 * 8);
        *(byte *)((long)local_48 + (ulong)uVar7) = *(byte *)((long)local_48 + (ulong)uVar7) ^ 2;
        if (((*(ulong *)((long)local_58 + (ulong)uVar5 * 8) &
              *(ulong *)((long)local_58 + (ulong)uVar6 * 8) &
             *(ulong *)((long)local_58 + (ulong)uVar7 * 8)) == 0) &&
           ((((*(long *)((long)local_58 + (ulong)uVar5 * 8) == 0 &&
              (*(char *)((long)local_48 + (ulong)uVar5) == '\b')) ||
             ((*(long *)((long)local_58 + (ulong)uVar6 * 8) == 0 &&
              (*(char *)((long)local_48 + (ulong)uVar6) == '\b')))) ||
            ((*(long *)((long)local_58 + (ulong)uVar7 * 8) == 0 &&
             (*(char *)((long)local_48 + (ulong)uVar7) == '\b')))))) {
          local_b8 = local_b8 + 1;
          *(char *)((long)local_48 + (ulong)uVar5) = *(char *)((long)local_48 + (ulong)uVar5) + -4;
          *(ulong *)((long)local_58 + (ulong)uVar5 * 8) =
               uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar5 * 8);
          *(char *)((long)local_48 + (ulong)uVar6) = *(char *)((long)local_48 + (ulong)uVar6) + -4;
          *(byte *)((long)local_48 + (ulong)uVar6) = *(byte *)((long)local_48 + (ulong)uVar6) ^ 1;
          *(ulong *)((long)local_58 + (ulong)uVar6 * 8) =
               uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar6 * 8);
          *(char *)((long)local_48 + (ulong)uVar7) = *(char *)((long)local_48 + (ulong)uVar7) + -4;
          *(byte *)((long)local_48 + (ulong)uVar7) = *(byte *)((long)local_48 + (ulong)uVar7) ^ 2;
          *(ulong *)((long)local_58 + (ulong)uVar7 * 8) =
               uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar7 * 8);
        }
        if (*(byte *)((long)local_48 + (ulong)uVar5) < 4) {
          local_b4 = 1;
        }
        local_114 = local_b4;
        if (*(byte *)((long)local_48 + (ulong)uVar6) < 4) {
          local_114 = 1;
        }
        if (*(byte *)((long)local_48 + (ulong)uVar7) < 4) {
          local_118 = 1;
        }
        else {
          local_118 = local_114;
        }
        in_stack_fffffffffffffef0 = local_b4;
        local_b4 = local_118;
      }
      if (local_b4 == 0) {
        local_d8 = 0;
        for (local_dc = 0; local_dc < local_34; local_dc = local_dc + 1) {
          *(uint *)((long)local_40 + (ulong)local_d8 * 4) = local_dc;
          local_d8 = ((int)(uint)*(byte *)((long)local_48 + (ulong)local_dc) >> 2 == 1) + local_d8;
        }
        local_e0 = 0;
        while (local_d8 != 0) {
          local_d8 = local_d8 - 1;
          uVar4 = *(uint *)((long)local_40 + (ulong)local_d8 * 4);
          if ((int)(uint)*(byte *)((long)local_48 + (ulong)uVar4) >> 2 == 1) {
            uVar1 = *(ulong *)((long)local_58 + (ulong)uVar4 * 8);
            local_88[1] = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                            (binary_fuse8_t *)
                                            CONCAT17(in_stack_fffffffffffffef7,
                                                     CONCAT16(in_stack_fffffffffffffef6,
                                                              CONCAT24(in_stack_fffffffffffffef4,
                                                                       in_stack_fffffffffffffef0))))
            ;
            local_88[2] = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                            (binary_fuse8_t *)
                                            CONCAT17(in_stack_fffffffffffffef7,
                                                     CONCAT16(in_stack_fffffffffffffef6,
                                                              CONCAT24(in_stack_fffffffffffffef4,
                                                                       in_stack_fffffffffffffef0))))
            ;
            local_88[3] = binary_fuse8_hash(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                                            (binary_fuse8_t *)
                                            CONCAT17(in_stack_fffffffffffffef7,
                                                     CONCAT16(in_stack_fffffffffffffef6,
                                                              CONCAT24(in_stack_fffffffffffffef4,
                                                                       in_stack_fffffffffffffef0))))
            ;
            local_78 = local_88[1];
            bVar3 = *(byte *)((long)local_48 + (ulong)uVar4) & 3;
            *(byte *)((long)local_50 + (ulong)local_e0) = bVar3;
            *(ulong *)((long)local_30 + (ulong)local_e0 * 8) = uVar1;
            local_e0 = local_e0 + 1;
            uVar4 = local_88[(int)(bVar3 + 1)];
            *(uint *)((long)local_40 + (ulong)local_d8 * 4) = uVar4;
            local_d8 = ((int)(uint)*(byte *)((long)local_48 + (ulong)uVar4) >> 2 == 2) + local_d8;
            *(char *)((long)local_48 + (ulong)uVar4) = *(char *)((long)local_48 + (ulong)uVar4) + -4
            ;
            bVar2 = binary_fuse_mod3(bVar3 + 1);
            *(byte *)((long)local_48 + (ulong)uVar4) =
                 *(byte *)((long)local_48 + (ulong)uVar4) ^ bVar2;
            *(ulong *)((long)local_58 + (ulong)uVar4 * 8) =
                 uVar1 ^ *(ulong *)((long)local_58 + (ulong)uVar4 * 8);
            in_stack_ffffffffffffff04 = local_88[(int)(bVar3 + 2)];
            *(uint *)((long)local_40 + (ulong)local_d8 * 4) = in_stack_ffffffffffffff04;
            local_d8 = ((int)(uint)*(byte *)((long)local_48 + (ulong)in_stack_ffffffffffffff04) >> 2
                       == 2) + local_d8;
            *(char *)((long)local_48 + (ulong)in_stack_ffffffffffffff04) =
                 *(char *)((long)local_48 + (ulong)in_stack_ffffffffffffff04) + -4;
            bVar3 = binary_fuse_mod3(bVar3 + 2);
            *(byte *)((long)local_48 + (ulong)in_stack_ffffffffffffff04) =
                 *(byte *)((long)local_48 + (ulong)in_stack_ffffffffffffff04) ^ bVar3;
            *(ulong *)((long)local_58 + (ulong)in_stack_ffffffffffffff04 * 8) =
                 uVar1 ^ *(ulong *)((long)local_58 + (ulong)in_stack_ffffffffffffff04 * 8);
          }
        }
        if (local_e0 + local_b8 == local_14) {
          local_14 = local_e0;
          while (local_e0 = local_e0 - 1, local_e0 < local_14) {
            uVar8 = *(uint64_t *)((long)local_30 + (ulong)local_e0 * 8);
            uVar10 = binary_fuse8_fingerprint(uVar8);
            bVar2 = (byte)uVar10;
            bVar3 = *(byte *)((long)local_50 + (ulong)local_e0);
            local_88[0] = binary_fuse8_hash(in_stack_ffffffffffffff04,uVar8,
                                            (binary_fuse8_t *)
                                            CONCAT17(bVar2,CONCAT16(bVar3,CONCAT24(
                                                  in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0))));
            local_88[1] = binary_fuse8_hash(in_stack_ffffffffffffff04,uVar8,
                                            (binary_fuse8_t *)
                                            CONCAT17(bVar2,CONCAT16(bVar3,CONCAT24(
                                                  in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0))));
            local_88[2] = binary_fuse8_hash(in_stack_ffffffffffffff04,uVar8,
                                            (binary_fuse8_t *)
                                            CONCAT17(bVar2,CONCAT16(bVar3,CONCAT24(
                                                  in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0))));
            local_88[3] = local_88[0];
            local_78 = local_88[1];
            *(byte *)(local_20[4] + (ulong)local_88[bVar3]) =
                 bVar2 ^ *(byte *)(local_20[4] + (ulong)local_88[(int)(bVar3 + 1)]) ^
                 *(byte *)(local_20[4] + (ulong)local_88[(int)(bVar3 + 2)]);
          }
          free(local_40);
          free(local_48);
          free(local_50);
          free(local_58);
          free(local_30);
          free(local_68);
          return true;
        }
        if (local_b8 != 0) {
          sVar9 = binary_fuse_sort_and_remove_dup
                            ((uint64_t *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             in_stack_fffffffffffffef8);
          local_14 = (uint)sVar9;
        }
        memset(local_30,0,(ulong)local_14 << 3);
        memset(local_48,0,(ulong)local_34);
        memset(local_58,0,(ulong)local_34 << 3);
        uVar8 = binary_fuse_rng_splitmix64(&local_28);
        *local_20 = uVar8;
      }
      else {
        memset(local_30,0,(ulong)local_14 << 3);
        memset(local_48,0,(ulong)local_34);
        memset(local_58,0,(ulong)local_34 << 3);
        uVar8 = binary_fuse_rng_splitmix64(&local_28);
        *local_20 = uVar8;
      }
    }
    memset((void *)local_20[4],0xff,(ulong)(uint)local_20[3]);
    free(local_40);
    free(local_48);
    free(local_50);
    free(local_58);
    free(local_30);
    free(local_68);
  }
  return false;
}

Assistant:

static inline bool binary_fuse8_populate(uint64_t *keys, uint32_t size,
                           binary_fuse8_t *filter) {
  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1 << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system)
      memset(filter->Fingerprints, ~0, filter->ArrayLength);
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = ((uint64_t)i * size) >> blockBits;
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse8_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse8_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse8_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2) == 1) ? 1 : 0;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse8_hash(0, hash, filter);
        h012[1] = binary_fuse8_hash(1, hash, filter);
        h012[2] = binary_fuse8_hash(2, hash, filter);
        h012[3] = binary_fuse8_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2) == 2 ? 1 : 0);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2) == 2 ? 1 : 0);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    } else if(duplicates > 0) {
      size = binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint8_t xor2 = binary_fuse8_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse8_hash(0, hash, filter);
    h012[1] = binary_fuse8_hash(1, hash, filter);
    h012[2] = binary_fuse8_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = xor2 ^
                                        filter->Fingerprints[h012[found + 1]] ^
                                        filter->Fingerprints[h012[found + 2]];
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}